

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

bool __thiscall implementations::scheme::SchemeFrame::dispatchCall(SchemeFrame *this)

{
  _instruction_type _Var1;
  const_iterator it_00;
  instruction ins;
  const_iterator it;
  SchemeFrame *this_local;
  
  it_00 = std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ::cbegin(&this->resolved_arguments);
  _Var1 = SchemeInstructionConverter::convert(&this->exp);
  switch(_Var1) {
  case If:
    this_local._7_1_ =
         SchemeDispatcher<(implementations::scheme::instruction::instruction)1>::dispatch
                   (this,it_00);
    break;
  case Set:
    this_local._7_1_ =
         SchemeDispatcher<(implementations::scheme::instruction::instruction)2>::dispatch
                   (this,it_00);
    break;
  case Define:
    this_local._7_1_ =
         SchemeDispatcher<(implementations::scheme::instruction::instruction)3>::dispatch
                   (this,it_00);
    break;
  default:
    this_local._7_1_ =
         SchemeDispatcher<(implementations::scheme::instruction::instruction)7>::dispatch
                   (this,it_00);
    break;
  case Begin:
    this_local._7_1_ =
         SchemeDispatcher<(implementations::scheme::instruction::instruction)5>::dispatch
                   (this,it_00);
    break;
  case Proc:
    this_local._7_1_ =
         SchemeDispatcher<(implementations::scheme::instruction::instruction)6>::dispatch
                   (this,it_00);
  }
  return this_local._7_1_;
}

Assistant:

bool SchemeFrame::dispatchCall() {
	// all of our arguments are now resolved, dispatch
	cells::const_iterator it = resolved_arguments.cbegin();
	instruction::instruction ins = SchemeInstructionConverter::convert(exp);
	switch (ins) {
	case instruction::If:
		return SchemeDispatcher<instruction::If>::dispatch(*this, it);
	case instruction::Begin:
		return SchemeDispatcher<instruction::Begin>::dispatch(*this, it);
	case instruction::Set:
		return SchemeDispatcher<instruction::Set>::dispatch(*this, it);
	case instruction::Define:
		return SchemeDispatcher<instruction::Define>::dispatch(*this, it);
	case instruction::Proc:
		return SchemeDispatcher<instruction::Proc>::dispatch(*this, it);
	default:
		return SchemeDispatcher<instruction::Invalid>::dispatch(*this, it);
	}
}